

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O2

void __thiscall kratos::DebugDatabase::set_break_points(DebugDatabase *this,Generator *top)

{
  string local_48;
  allocator<char> local_21;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,".py",&local_21);
  set_break_points(this,top,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void DebugDatabase::set_break_points(Generator *top) { set_break_points(top, ".py"); }